

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::Matchers::StdString::StartsWithMatcher::match(StartsWithMatcher *this,string *source)

{
  ulong __n;
  int iVar1;
  bool bVar2;
  string local_38;
  
  CasedString::adjustString(&local_38,&(this->super_StringMatcherBase).m_comparator,source);
  __n = (this->super_StringMatcherBase).m_comparator.m_str._M_string_length;
  if (local_38._M_string_length < __n) {
    bVar2 = false;
  }
  else if (__n == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp((this->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p,
                 local_38._M_dataplus._M_p,__n);
    bVar2 = iVar1 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool StartsWithMatcher::match(std::string const &source) const {
        return startsWith(m_comparator.adjustString(source), m_comparator.m_str);
      }